

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_group_set_scroll(nk_context *ctx,char *id,nk_uint x_offset,nk_uint y_offset)

{
  int len;
  nk_hash name;
  nk_window *win_00;
  nk_uint *pnVar1;
  nk_uint in_ECX;
  nk_uint in_EDX;
  char *in_RSI;
  long in_RDI;
  nk_uint *y_offset_ptr;
  nk_uint *x_offset_ptr;
  nk_window *win;
  nk_hash id_hash;
  int id_len;
  undefined8 in_stack_ffffffffffffffc8;
  nk_context *ctx_00;
  
  if ((((in_RDI != 0) && (*(long *)(in_RDI + 0x40d8) != 0)) &&
      (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) != 0)) && (in_RSI != (char *)0x0)) {
    ctx_00 = *(nk_context **)(in_RDI + 0x40d8);
    len = nk_strlen(in_RSI);
    name = nk_murmur_hash(in_RSI,len,2);
    win_00 = (nk_window *)nk_find_value((nk_window *)ctx_00,name);
    if (win_00 == (nk_window *)0x0) {
      win_00 = (nk_window *)
               nk_add_value(ctx_00,(nk_window *)0x0,
                            (nk_hash)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                            (nk_uint)in_stack_ffffffffffffffc8);
      pnVar1 = nk_add_value(ctx_00,win_00,(nk_hash)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                            (nk_uint)in_stack_ffffffffffffffc8);
      if (win_00 == (nk_window *)0x0) {
        return;
      }
      if (pnVar1 == (nk_uint *)0x0) {
        return;
      }
      *pnVar1 = 0;
      win_00->seq = 0;
    }
    else {
      pnVar1 = nk_find_value((nk_window *)ctx_00,name + 1);
    }
    win_00->seq = in_EDX;
    *pnVar1 = in_ECX;
  }
  return;
}

Assistant:

NK_API void
nk_group_set_scroll(struct nk_context *ctx, const char *id, nk_uint x_offset, nk_uint y_offset)
{
int id_len;
nk_hash id_hash;
struct nk_window *win;
nk_uint *x_offset_ptr;
nk_uint *y_offset_ptr;

NK_ASSERT(ctx);
NK_ASSERT(id);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout || !id)
return;

/* find persistent group scrollbar value */
win = ctx->current;
id_len = (int)nk_strlen(id);
id_hash = nk_murmur_hash(id, (int)id_len, NK_PANEL_GROUP);
x_offset_ptr = nk_find_value(win, id_hash);
if (!x_offset_ptr) {
x_offset_ptr = nk_add_value(ctx, win, id_hash, 0);
y_offset_ptr = nk_add_value(ctx, win, id_hash+1, 0);

NK_ASSERT(x_offset_ptr);
NK_ASSERT(y_offset_ptr);
if (!x_offset_ptr || !y_offset_ptr) return;
*x_offset_ptr = *y_offset_ptr = 0;
} else y_offset_ptr = nk_find_value(win, id_hash+1);
*x_offset_ptr = x_offset;
*y_offset_ptr = y_offset;
}